

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propagate_cross_product.cpp
# Opt level: O1

unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true> __thiscall
duckdb::StatisticsPropagator::PropagateStatistics
          (StatisticsPropagator *this,LogicalCrossProduct *cp,
          unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
          *node_ptr)

{
  type new_stats;
  pointer *__ptr;
  StatisticsPropagator *this_00;
  unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true> left_stats;
  unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true> right_stats;
  undefined1 local_28 [16];
  
  vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
  ::operator[]((vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                *)(node_ptr + 2),0);
  PropagateStatistics((StatisticsPropagator *)local_28,
                      (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                       *)cp);
  vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
  ::operator[]((vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                *)(node_ptr + 2),1);
  PropagateStatistics((StatisticsPropagator *)(local_28 + 8),
                      (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                       *)cp);
  if (((Optimizer *)local_28._0_8_ == (Optimizer *)0x0) ||
     ((ClientContext *)local_28._8_8_ == (ClientContext *)0x0)) {
    this->optimizer = (Optimizer *)0x0;
  }
  else {
    this_00 = (StatisticsPropagator *)(local_28 + 8);
    new_stats = unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true>
                ::operator*((unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true>
                             *)this_00);
    MultiplyCardinalities
              (this_00,(unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true>
                        *)local_28,new_stats);
    this->optimizer = (Optimizer *)local_28._0_8_;
    local_28._0_8_ = (_Head_base<0UL,_duckdb::NodeStatistics_*,_false>)0x0;
  }
  if ((ClientContext *)local_28._8_8_ != (ClientContext *)0x0) {
    operator_delete((void *)local_28._8_8_);
  }
  if ((_Head_base<0UL,_duckdb::NodeStatistics_*,_false>)local_28._0_8_ !=
      (_Head_base<0UL,_duckdb::NodeStatistics_*,_false>)0x0) {
    operator_delete((void *)local_28._0_8_);
  }
  return (unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>_>)
         (unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>_>)this;
}

Assistant:

unique_ptr<NodeStatistics> StatisticsPropagator::PropagateStatistics(LogicalCrossProduct &cp,
                                                                     unique_ptr<LogicalOperator> &node_ptr) {
	// first propagate statistics in the child node
	auto left_stats = PropagateStatistics(cp.children[0]);
	auto right_stats = PropagateStatistics(cp.children[1]);
	if (!left_stats || !right_stats) {
		return nullptr;
	}
	MultiplyCardinalities(left_stats, *right_stats);
	return left_stats;
}